

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O1

ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>
anon_unknown.dwarf_1d734c9::gtest_CAV1FwdTxfm2d_EvalGenerator_(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  testing *in_RDI;
  ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> PVar2;
  undefined8 local_28;
  undefined8 local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  GetTxfm2dParamList();
  PVar2 = testing::
          ValuesIn<__gnu_cxx::__normal_iterator<std::tuple<unsigned_char,unsigned_char,double,double>const*,std::vector<std::tuple<unsigned_char,unsigned_char,double,double>,std::allocator<std::tuple<unsigned_char,unsigned_char,double,double>>>>>
                    (in_RDI,local_28,local_20);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_28 != (tuple<unsigned_char,_unsigned_char,_double,_double> *)0x0) {
    operator_delete(local_28);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)in_RDI;
  return (ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

TEST_P(AV1FwdTxfm2d, RunFwdAccuracyCheck) { RunFwdAccuracyCheck(); }